

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O3

int mbedtls_asn1_get_bool(uchar **p,uchar *end,int *val)

{
  uchar *puVar1;
  int iVar2;
  size_t len;
  size_t local_18;
  
  puVar1 = *p;
  local_18 = (long)end - (long)puVar1;
  if (0 < (long)local_18) {
    iVar2 = -0x62;
    if (*puVar1 == '\x01') {
      *p = puVar1 + 1;
      iVar2 = mbedtls_asn1_get_len(p,end,&local_18);
      if ((iVar2 == 0) && (iVar2 = -100, local_18 == 1)) {
        puVar1 = *p;
        *val = (uint)(*puVar1 != '\0');
        *p = puVar1 + 1;
        iVar2 = 0;
      }
    }
    return iVar2;
  }
  return -0x60;
}

Assistant:

int mbedtls_asn1_get_bool( unsigned char **p,
                   const unsigned char *end,
                   int *val )
{
    int ret;
    size_t len;

    if( ( ret = mbedtls_asn1_get_tag( p, end, &len, MBEDTLS_ASN1_BOOLEAN ) ) != 0 )
        return( ret );

    if( len != 1 )
        return( MBEDTLS_ERR_ASN1_INVALID_LENGTH );

    *val = ( **p != 0 ) ? 1 : 0;
    (*p)++;

    return( 0 );
}